

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

void __thiscall ipx::Basis::PivotFreeVariablesIntoBasis(Basis *this,double *colweights,Info *info)

{
  iterator __position;
  ipxint *piVar1;
  int iVar2;
  Model *pMVar3;
  bool bVar4;
  Int IVar5;
  ostream *poVar6;
  int iVar7;
  pointer piVar8;
  Info *pIVar9;
  int iVar10;
  ulong uVar11;
  Control *this_00;
  Int ii;
  string *in_R8;
  long lVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  vector<int,_std::allocator<int>_> remaining;
  bool exchanged;
  IndexedVector ftran;
  stringstream h_logging_stream;
  char local_249;
  int *local_248;
  iterator iStack_240;
  int *local_238;
  ulong local_230;
  double local_228;
  Info *local_220;
  string local_218;
  IndexedVector local_1f8;
  double local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [24];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  IVar5 = this->model_->num_rows_;
  iVar7 = this->model_->num_cols_;
  IndexedVector::IndexedVector(&local_1f8,IVar5);
  this_00 = this->control_;
  local_228 = (this_00->parameters_).super_ipx_parameters.dependency_tol;
  (info->super_ipx_info).errflag = 0;
  (info->super_ipx_info).dependent_cols = 0;
  local_248 = (int *)0x0;
  iStack_240._M_current = (int *)0x0;
  local_238 = (int *)0x0;
  local_1b8._0_4_ = 0;
  iVar13 = iVar7 + IVar5;
  local_220 = info;
  if (iVar13 != 0 && SCARRY4(iVar7,IVar5) == iVar13 < 0) {
    do {
      if ((ABS(colweights[(int)local_1b8._0_4_]) == INFINITY) &&
         ((this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)local_1b8._0_4_] < 0)) {
        if (iStack_240._M_current == local_238) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_248,iStack_240,(int *)local_1b8);
        }
        else {
          *iStack_240._M_current = local_1b8._0_4_;
          iStack_240._M_current = iStack_240._M_current + 1;
        }
      }
      local_1b8._0_4_ = local_1b8._0_4_ + 1;
    } while ((int)local_1b8._0_4_ < iVar13);
    this_00 = this->control_;
  }
  poVar6 = Control::Debug(this_00,1);
  pIVar9 = local_220;
  Textline<char[35]>((string *)local_1b8,(char (*) [35])"Number of free variables nonbasic:");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),local_1b8._8_8_);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  local_218._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_218,1);
  if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
  }
  Control::ResetPrintInterval(this->control_);
  if (local_248 == iStack_240._M_current) {
    local_230 = 0;
  }
  else {
    if (local_228 <= 0.0) {
      local_228 = 0.0;
    }
    local_230 = 0;
    do {
      iVar7 = iStack_240._M_current[-1];
      IVar5 = Control::InterruptCheck(this->control_,-1);
      (pIVar9->super_ipx_info).errflag = IVar5;
      if (IVar5 != 0) goto LAB_0038f50d;
      SolveForUpdate(this,iVar7,&local_1f8);
      bVar4 = IndexedVector::sparse(&local_1f8);
      if (bVar4) {
        if ((long)local_1f8.nnz_ < 1) goto LAB_0038f1b3;
        piVar8 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar13 = -1;
        iVar10 = -1;
        lVar12 = 0;
        dVar17 = 0.0;
        dVar18 = 0.0;
        do {
          iVar2 = *(int *)((long)&((_Alloc_hider *)
                                  local_1f8.pattern_.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->_M_p + lVar12 * 4);
          dVar14 = ABS(local_1f8.elements_._M_data[iVar2]);
          if (dVar17 < dVar14) {
            iVar13 = iVar2;
          }
          dVar16 = dVar14;
          if (ABS(colweights[piVar8[iVar2]]) == INFINITY || dVar14 <= dVar18) {
            dVar16 = dVar18;
          }
          dVar15 = dVar14;
          if (dVar14 <= dVar17) {
            dVar15 = dVar17;
          }
          if (ABS(colweights[piVar8[iVar2]]) != INFINITY && dVar14 > dVar18) {
            iVar10 = iVar2;
          }
          lVar12 = lVar12 + 1;
          pIVar9 = local_220;
          in_R8 = (string *)
                  local_1f8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
          dVar17 = dVar15;
          dVar18 = dVar16;
        } while (local_1f8.nnz_ != lVar12);
LAB_0038f0b7:
        if ((4.0 < dVar15) && (dVar16 < 1.0)) {
          local_1b8._0_4_ = piVar8[iVar13];
          in_R8 = &local_218;
          IVar5 = ExchangeIfStable(this,local_1b8._0_4_,iVar7,local_1f8.elements_._M_data[iVar13],-1
                                   ,(bool *)in_R8);
          (pIVar9->super_ipx_info).errflag = IVar5;
          iVar7 = 1;
          if (IVar5 != 0) goto LAB_0038f244;
          iVar7 = 5;
          if ((char)local_218._M_dataplus._M_p != '\x01') goto LAB_0038f244;
          __position._M_current = iStack_240._M_current + -1;
          if (__position._M_current == local_238) {
            iStack_240._M_current = __position._M_current;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_248,__position,(int *)local_1b8);
          }
          else {
            iStack_240._M_current[-1] = local_1b8._0_4_;
          }
          piVar1 = &(pIVar9->super_ipx_info).updates_start;
          *piVar1 = *piVar1 + 1;
          local_230 = (ulong)((int)local_230 + 1);
          goto LAB_0038f392;
        }
        if (dVar16 <= local_228) goto LAB_0038f1b3;
        in_R8 = (string *)local_1b8;
        IVar5 = ExchangeIfStable(this,(this->basis_).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[iVar10],iVar7,
                                 local_1f8.elements_._M_data[iVar10],-1,(bool *)in_R8);
        (pIVar9->super_ipx_info).errflag = IVar5;
        iVar7 = 1;
        if (IVar5 == 0) {
          iVar7 = 5;
          if (local_1b8[0] != (stringstream)0x0) {
            iStack_240._M_current = iStack_240._M_current + -1;
            piVar1 = &(pIVar9->super_ipx_info).updates_start;
            *piVar1 = *piVar1 + 1;
            goto LAB_0038f392;
          }
        }
LAB_0038f244:
        if (iVar7 != 5) goto LAB_0038f50d;
      }
      else {
        if (0 < (int)(uint)local_1f8.elements_._M_size) {
          piVar8 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar13 = -1;
          uVar11 = 0xffffffff;
          in_R8 = (string *)0x0;
          dVar17 = 0.0;
          dVar18 = 0.0;
          do {
            dVar14 = ABS(local_1f8.elements_._M_data[(long)in_R8]);
            if (dVar17 < dVar14) {
              iVar13 = (int)in_R8;
            }
            dVar16 = dVar14;
            if (ABS(colweights[piVar8[(long)in_R8]]) == INFINITY || dVar14 <= dVar18) {
              dVar16 = dVar18;
            }
            dVar15 = dVar14;
            if (dVar14 <= dVar17) {
              dVar15 = dVar17;
            }
            if (ABS(colweights[piVar8[(long)in_R8]]) != INFINITY && dVar14 > dVar18) {
              uVar11 = (ulong)in_R8 & 0xffffffff;
            }
            iVar10 = (int)uVar11;
            in_R8 = (string *)((long)&(in_R8->_M_dataplus)._M_p + 1);
            dVar17 = dVar15;
            dVar18 = dVar16;
          } while ((string *)(ulong)((uint)local_1f8.elements_._M_size & 0x7fffffff) != in_R8);
          goto LAB_0038f0b7;
        }
LAB_0038f1b3:
        if ((pIVar9->super_ipx_info).cols_inconsistent == 0) {
          pMVar3 = this->model_;
          local_1c8 = (pMVar3->c_)._M_data[iVar7];
          uStack_1c0 = 0;
          bVar4 = IndexedVector::sparse(&local_1f8);
          dVar17 = local_1c8;
          if (bVar4) {
            if (0 < (long)local_1f8.nnz_) {
              lVar12 = 0;
              do {
                in_R8 = (string *)
                        (long)*(int *)((long)&((_Alloc_hider *)
                                              local_1f8.pattern_.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start)->_M_p + lVar12 * 4);
                iVar7 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)in_R8];
                if (ABS(colweights[iVar7]) == INFINITY) {
                  dVar17 = dVar17 - (pMVar3->c_)._M_data[iVar7] *
                                    local_1f8.elements_._M_data[(long)in_R8];
                }
                lVar12 = lVar12 + 1;
              } while (local_1f8.nnz_ != lVar12);
            }
          }
          else if (0 < (int)(uint)local_1f8.elements_._M_size) {
            uVar11 = 0;
            do {
              iVar7 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11];
              in_R8 = (string *)((ulong)colweights[iVar7] & 0x7fffffffffffffff);
              if (in_R8 == (string *)&DAT_7ff0000000000000) {
                in_R8 = (string *)(pMVar3->c_)._M_data;
                dVar17 = dVar17 - (double)(&in_R8->_M_dataplus)[iVar7]._M_p *
                                  local_1f8.elements_._M_data[uVar11];
              }
              uVar11 = uVar11 + 1;
            } while (((uint)local_1f8.elements_._M_size & 0x7fffffff) != uVar11);
          }
          pIVar9 = local_220;
          if (local_228 < ABS(dVar17)) {
            local_1c8 = dVar17;
            poVar6 = Control::Debug(this->control_,1);
            Textline<char[44]>((string *)local_1b8,
                               (char (*) [44])"Unbounded primal ray with objective change:");
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
                                local_1b8._8_8_);
            pIVar9 = local_220;
            Format_abi_cxx11_(&local_218,(ipx *)0x0,local_1c8,2,0x100,(fmtflags)in_R8);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_218._M_dataplus._M_p,local_218._M_string_length);
            local_249 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_249,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p);
            }
            if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
            }
            (pIVar9->super_ipx_info).cols_inconsistent = 1;
          }
        }
        piVar1 = &(pIVar9->super_ipx_info).dependent_cols;
        *piVar1 = *piVar1 + 1;
        iStack_240._M_current = iStack_240._M_current + -1;
LAB_0038f392:
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        local_218._M_string_length = 0;
        local_218.field_2._M_local_buf[0] = '\0';
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::stringbuf::str(local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10)," ",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," free variables remaining\n",0x1a);
        Control::hIntervalLog(this->control_,(stringstream *)local_1b8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
    } while (local_248 != iStack_240._M_current);
  }
  poVar6 = Control::Debug(this->control_,1);
  Textline<char[48]>((string *)local_1b8,
                     (char (*) [48])"Number of free variables swapped for stability:");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),local_1b8._8_8_);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_230);
  local_218._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_218,1);
  if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
  }
LAB_0038f50d:
  if (local_248 != (int *)0x0) {
    operator_delete(local_248);
  }
  if ((string *)
      local_1f8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (string *)0x0) {
    operator_delete(local_1f8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_1f8.elements_._M_data);
  return;
}

Assistant:

void Basis::PivotFreeVariablesIntoBasis(const double* colweights, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    IndexedVector ftran(m);
    const double dependency_tol = std::max(0.0, control_.dependency_tol());
    info->errflag = 0;
    info->dependent_cols = 0;
    Int stability_pivots = 0;

    // Maintain stack of free nonbasic variables.
    std::vector<Int> remaining;
    for (Int j = 0; j < n+m; j++) {
        if (std::isinf(colweights[j]) && map2basis_[j] < 0)
            remaining.push_back(j);
    }
    control_.Debug() << Textline("Number of free variables nonbasic:")
                  << remaining.size() << '\n';

    control_.ResetPrintInterval();
    while (!remaining.empty()) {
        Int jn = remaining.back();
        assert(std::isinf(colweights[jn]));
        assert(map2basis_[jn] < 0);
        if ((info->errflag = control_.InterruptCheck()) != 0)
            return;

        SolveForUpdate(jn, ftran);
        Int pmax = -1;
        Int pmax_nonfree = -1;
        double fmax = 0.0;
        double fmax_nonfree = 0.0;
        auto update_max = [&](Int p, double f) {
            f = std::abs(f);
            if (f > fmax) {
                fmax = f;
                pmax = p;
            }
            if (!std::isinf(colweights[basis_[p]])) {
                if (f > fmax_nonfree) {
                    fmax_nonfree = f;
                    pmax_nonfree = p;
                }
            }
        };
        for_each_nonzero(ftran, update_max);

        if (fmax > 4.0 && fmax_nonfree < 1.0) {
            Int jb = basis_[pmax];
            assert(std::isinf(colweights[jb]));
            bool exchanged;
            info->errflag = ExchangeIfStable(jb, jn, ftran[pmax], -1,
                                             &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            remaining.pop_back();
            remaining.push_back(jb);
            info->updates_start++;
            stability_pivots++;
        } else {
            if (fmax_nonfree <= dependency_tol) {
                // jn cannot be pivoted into the basis. If we do not have an
                // unbounded primal ray yet, then test if column jn yields one.
                // Compute the change in the primal objective that is caused by
                // a unit increase of x[jn] with corresponding adjustment of
                // free basic variables.
                if (!info->cols_inconsistent) {
                    const Vector& c = model_.c();
                    double delta_obj = c[jn];
                    auto update_delta_obj = [&](Int p, double f) {
                        Int j = basis_[p];
                        if (std::isinf(colweights[j]))
                            delta_obj -= c[j] * f;
                    };
                    for_each_nonzero(ftran, update_delta_obj);
                    if (std::abs(delta_obj) > dependency_tol) {
                        control_.Debug()
                            << Textline(
                                "Unbounded primal ray with objective change:")
                            << sci2(delta_obj) << '\n';
                        info->cols_inconsistent = true;
                    }
                }
                info->dependent_cols++;
                remaining.pop_back();
            } else {
                Int jb = basis_[pmax_nonfree];
                bool exchanged;
                info->errflag = ExchangeIfStable(jb, jn, ftran[pmax_nonfree],
                                                 -1, &exchanged);
                if (info->errflag)
                    return;
                if (!exchanged)     // factorization was unstable, try again
                    continue;
                remaining.pop_back();
                info->updates_start++;
            }
        }
	std::stringstream h_logging_stream;
	h_logging_stream.str(std::string());
	h_logging_stream << " " << remaining.size() << " free variables remaining\n";
	control_.hIntervalLog(h_logging_stream);
    }
    control_.Debug()
        << Textline("Number of free variables swapped for stability:")
        << stability_pivots << '\n';
}